

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxGetDefaultByType::Resolve(FxGetDefaultByType *this,FCompileContext *ctx)

{
  PType *p;
  int iVar1;
  undefined4 extraout_var;
  PClassPointer *pPVar2;
  PClass *p_00;
  PClassActor *restrict;
  FxExpression *pFVar3;
  PPointer *pPVar4;
  PClassActor *pPVar5;
  FScriptPosition *pFVar6;
  ExpVal local_40;
  FString local_30;
  undefined4 local_24;
  
  if (this->Self != (FxExpression *)0x0) {
    iVar1 = (*this->Self->_vptr_FxExpression[2])();
    pFVar3 = (FxExpression *)CONCAT44(extraout_var,iVar1);
    this->Self = pFVar3;
    if (pFVar3 != (FxExpression *)0x0) {
      p = pFVar3->ValueType;
      if ((p == (PType *)TypeString) || (p == (PType *)TypeName)) {
        iVar1 = (*pFVar3->_vptr_FxExpression[3])(pFVar3);
        if ((char)iVar1 == '\0') {
          local_40.field_1 =
               (anon_union_8_3_addc324a_for_ExpVal_1)
               ((anon_union_8_3_addc324a_for_ExpVal_1 *)(this->Self + 1))->pointer;
          pFVar6 = &this->Self[1].ScriptPosition;
          if ((PString *)local_40.field_1.pointer == TypeString) {
            FString::AttachToOther(&local_30,&pFVar6->FileName);
          }
          else {
            local_30.Chars = (pFVar6->FileName).Chars;
          }
          ExpVal::GetString(&local_40);
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "GetDefaultByType() requires an actor class type, but got %s",
                     CONCAT44(local_40.Type._4_4_,local_40.Type._0_4_));
        }
        else {
          local_40.field_1 =
               (anon_union_8_3_addc324a_for_ExpVal_1)
               ((anon_union_8_3_addc324a_for_ExpVal_1 *)(this->Self + 1))->pointer;
          pFVar6 = &this->Self[1].ScriptPosition;
          if ((PString *)local_40.field_1.pointer == TypeString) {
            FString::AttachToOther(&local_30,&pFVar6->FileName);
          }
          else {
            local_30.Chars = (pFVar6->FileName).Chars;
          }
          ExpVal::GetName((ExpVal *)&local_24);
          local_40.Type._0_4_ = local_24;
          p_00 = PClass::FindClass((FName *)&local_40);
          restrict = dyn_cast<PClassActor>((DObject *)p_00);
          if ((PString *)local_40.field_1.pointer == TypeString) {
            FString::~FString(&local_30);
          }
          if (restrict != (PClassActor *)0x0) {
            pFVar3 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x38);
            pPVar2 = NewClassPointer(&restrict->super_PClass);
            pFVar3->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
            FScriptPosition::FScriptPosition
                      (&pFVar3->ScriptPosition,&(this->super_FxExpression).ScriptPosition);
            pFVar3->ExprType = EFX_Constant;
            pFVar3->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_0070d3e8;
            pFVar3[1].ScriptPosition.FileName.Chars = (char *)restrict;
            pFVar3->ValueType = (PType *)pPVar2;
            pFVar3[1]._vptr_FxExpression = (_func_int **)pPVar2;
            pFVar3->isresolved = true;
            pFVar3->NeedResult = true;
            this->Self = pFVar3;
            goto LAB_00535df1;
          }
          local_40.field_1 =
               (anon_union_8_3_addc324a_for_ExpVal_1)
               ((anon_union_8_3_addc324a_for_ExpVal_1 *)(this->Self + 1))->pointer;
          pFVar6 = &this->Self[1].ScriptPosition;
          if ((PString *)local_40.field_1.pointer == TypeString) {
            FString::AttachToOther(&local_30,&pFVar6->FileName);
          }
          else {
            local_30.Chars = (pFVar6->FileName).Chars;
          }
          ExpVal::GetString(&local_40);
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "GetDefaultByType() requires an actor class type, but got %s",
                     CONCAT44(local_40.Type._4_4_,local_40.Type._0_4_));
        }
        FString::~FString((FString *)&local_40);
        if ((PString *)local_40.field_1.pointer == TypeString) {
          FString::~FString(&local_30);
        }
      }
      else {
        pPVar2 = dyn_cast<PClassPointer>((DObject *)p);
        if (pPVar2 != (PClassPointer *)0x0) {
          restrict = (PClassActor *)pPVar2->ClassRestriction;
          pPVar5 = restrict;
          if (restrict == (PClassActor *)AActor::RegistrationInfo.MyClass) {
LAB_00535df1:
            pPVar4 = NewPointer((PType *)restrict,true);
            (this->super_FxExpression).ValueType = (PType *)pPVar4;
            return &this->super_FxExpression;
          }
          do {
            pPVar5 = (PClassActor *)(pPVar5->super_PClass).ParentClass;
            if (pPVar5 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
          } while (pPVar5 != (PClassActor *)0x0);
          if (pPVar5 != (PClassActor *)0x0) goto LAB_00535df1;
        }
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "GetDefaultByType() requires an actor class type");
      }
    }
  }
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxGetDefaultByType::Resolve(FCompileContext &ctx)
{
	SAFE_RESOLVE(Self, ctx);
	PClass *cls = nullptr;

	if (Self->ValueType == TypeString || Self->ValueType == TypeName)
	{
		if (Self->isConstant())
		{
			cls = PClass::FindActor(static_cast<FxConstant *>(Self)->GetValue().GetName());
			if (cls == nullptr)
			{
				ScriptPosition.Message(MSG_ERROR, "GetDefaultByType() requires an actor class type, but got %s", static_cast<FxConstant *>(Self)->GetValue().GetString().GetChars());
				delete this;
				return nullptr;
			}
			Self = new FxConstant(cls, NewClassPointer(cls), ScriptPosition);
		}
		else
		{
			// this is the ugly case. We do not know what we have and cannot do proper type casting.
			// For now error out and let this case require explicit handling on the user side.
			ScriptPosition.Message(MSG_ERROR, "GetDefaultByType() requires an actor class type, but got %s", static_cast<FxConstant *>(Self)->GetValue().GetString().GetChars());
			delete this;
			return nullptr;
		}
	}
	else
	{
		auto cp = dyn_cast<PClassPointer>(Self->ValueType);
		if (cp == nullptr || !cp->ClassRestriction->IsDescendantOf(RUNTIME_CLASS(AActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "GetDefaultByType() requires an actor class type");
			delete this;
			return nullptr;
		}
		cls = cp->ClassRestriction;
	}
	ValueType = NewPointer(cls, true);
	return this;
}